

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Psr_ManWriteVerilogArray(FILE *pFile,Psr_Ntk_t *p,Vec_Int_t *vSigs,int Start,int Stop,int fOdd)

{
  char *pcVar1;
  ulong uVar2;
  
  if (vSigs->nSize < 1) {
    __assert_fail("Vec_IntSize(vSigs) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacWriteVer.c"
                  ,0x46,
                  "void Psr_ManWriteVerilogArray(FILE *, Psr_Ntk_t *, Vec_Int_t *, int, int, int)");
  }
  if (Start < Stop) {
    uVar2 = (ulong)(uint)Start;
    do {
      if ((Start < 0) || (vSigs->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (fOdd == 0 || (uVar2 & 1) != 0) {
        Psr_ManWriteVerilogSignal(pFile,p,vSigs->pArray[uVar2]);
        pcVar1 = "    \"%s\", ";
        if (Stop - 1 == uVar2) {
          pcVar1 = "T = %d\t\t";
        }
        fputs(pcVar1 + 8,(FILE *)pFile);
      }
      uVar2 = uVar2 + 1;
    } while ((int)uVar2 < Stop);
  }
  return;
}

Assistant:

void Psr_ManWriteVerilogArray( FILE * pFile, Psr_Ntk_t * p, Vec_Int_t * vSigs, int Start, int Stop, int fOdd )
{
    int i, Sig;
    assert( Vec_IntSize(vSigs) > 0 );
    Vec_IntForEachEntryStartStop( vSigs, Sig, i, Start, Stop )
    {
        if ( fOdd && !(i & 1) )
            continue;
        Psr_ManWriteVerilogSignal( pFile, p, Sig );
        fprintf( pFile, "%s", i == Stop - 1 ? "" : ", " );
    }
}